

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnndec.c
# Opt level: O0

uint32_t float16i(uint16_t val)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint local_1c;
  int shift;
  int32_t expn;
  uint32_t frac;
  uint32_t sign;
  uint16_t val_local;
  
  uVar2 = (val & 0x8000) << 0x10;
  shift = val & 0x3ff;
  local_1c = (int)(uint)val >> 10 & 0x1f;
  if (local_1c == 0) {
    if ((val & 0x3ff) == 0) {
      return uVar2;
    }
    uVar1 = 0x1f;
    if ((val & 0x3ff) != 0) {
      for (; (uint)shift >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    iVar3 = (uVar1 ^ 0x1f) - 0x15;
    shift = shift << ((byte)iVar3 & 0x1f) & 0x3ff;
    local_1c = 1 - iVar3;
  }
  else if (local_1c == 0x1f) {
    return uVar2 | 0x7f800000 | shift << 0xd;
  }
  return uVar2 | (local_1c + 0x70) * 0x800000 | shift << 0xd;
}

Assistant:

static uint32_t float16i(uint16_t val)
{
	uint32_t sign = ((uint32_t)(val & 0x8000)) << 16;
	uint32_t frac = val & 0x3ff;
	int32_t  expn = (val >> 10) & 0x1f;

	if (expn == 0) {
		if (frac) {
			/* denormalized number: */
			int shift = __builtin_clz(frac) - 21;
			frac <<= shift;
			frac &= 0x3ff;
			expn = 1 - shift;
		} else {
			/* +/- zero: */
			return sign;
		}
	} else if (expn == 0x1f) {
		/* Inf/NaN: */
		return sign | 0x7f800000 | (frac << 13);
	}

	return sign | ((expn + 127 - 15) << 23) | (frac << 13);
}